

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrB
          (X3DImporter *this,int pAttrIdx,vector<bool,_std::allocator<bool>_> *pValue)

{
  char cVar1;
  FIReader *pFVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  size_t sVar5;
  size_t sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  WordIterator local_50;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  char *__s;
  
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar2,pAttrIdx);
  if (local_40 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(local_40,&FIValue::typeinfo,&FIBoolValue::typeinfo);
  }
  if (lVar4 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar4 = 0;
  }
  else {
    this_00 = local_38;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (lVar4 == 0) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    sVar5 = strlen(__s);
    sVar6 = strspn(__s,WordIterator::whitespace);
    local_50.start_ = (char *)0x0;
    if ((long)sVar6 < (long)sVar5) {
      local_50.start_ = __s + sVar6;
    }
    local_50.end_ = __s + sVar5;
    if (local_50.start_ != (char *)0x0) {
      do {
        cVar1 = *local_50.start_;
        iVar3 = tolower((int)cVar1);
        std::vector<bool,_std::allocator<bool>_>::push_back(pValue,iVar3 == 0x74 || cVar1 == 0x31);
        WordIterator::operator++(&local_50);
      } while (local_50.start_ != (char *)0x0);
    }
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (pValue,(vector<bool,_std::allocator<bool>_> *)(lVar4 + 8));
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrB(const int pAttrIdx, std::vector<bool>& pValue)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        pValue = boolValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::regex_match(match.str(), pattern_true); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return (::tolower(match[0]) == 't') || (match[0] == '1'); });
    }
}